

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O1

uint16_t eia608_row_column_pramble(int row,int col,int chan,int underline)

{
  uint uVar1;
  
  uVar1 = col + 3;
  if (-1 < col) {
    uVar1 = col;
  }
  return (ushort)(underline != 0) | (ushort)(uVar1 >> 1) & 0x1e |
         (ushort)eia608_parity_table[(ulong)((eia608_reverse_row_map[row & 0xf] & 1U) << 5) + 0x40]
         | (ushort)eia608_parity_table
                   [(eia608_reverse_row_map[row & 0xf] & 0xeU) * 0x80 + (uint)(chan != 0) * 0x800 +
                    0x1000 >> 8] << 8;
}

Assistant:

uint16_t eia608_row_column_pramble(int row, int col, int chan, int underline) { return eia608_row_pramble(row, chan, 0x10 | (col / 4), underline); }